

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O0

void __thiscall
sentencepiece::NBestSentencePieceText::NBestSentencePieceText
          (NBestSentencePieceText *this,NBestSentencePieceText *from)

{
  InternalMetadata *this_00;
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar1;
  long in_RSI;
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffff58;
  RepeatedPtrField<sentencepiece::SentencePieceText> *in_stack_ffffffffffffff68;
  RepeatedPtrField<sentencepiece::SentencePieceText> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  google::protobuf::MessageLite::MessageLite((MessageLite *)0x4502d6);
  *in_RDI = &PTR__NBestSentencePieceText_006f0ee0;
  google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText>::RepeatedPtrField
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  google::protobuf::internal::CachedSize::CachedSize((CachedSize *)0x450310);
  this_00 = (InternalMetadata *)(in_RSI + 8);
  if (((uint)this_00->ptr_ & 1) == 1) {
    if (((uint)this_00->ptr_ & 1) == 1) {
      pCVar1 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                         (this_00);
      local_20 = &pCVar1->unknown_fields;
    }
    else {
      local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(code *)0x0)();
    }
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              ((InternalMetadata *)local_20,in_stack_ffffffffffffff58);
  }
  return;
}

Assistant:

NBestSentencePieceText::NBestSentencePieceText(const NBestSentencePieceText& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      nbests_(from.nbests_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:sentencepiece.NBestSentencePieceText)
}